

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_EulerAngles *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Psi: ",5);
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Psi);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Theta: ",10);
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Theta);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",  Phi: ",8);
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_Phi);
  poVar1 = std::ostream::_M_insert<double>((double)(float)KVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString LE_EulerAngles::GetAsString() const
{
    KStringStream ss;

    ss << "Psi: "       << m_Psi.GetAsFloat32()
       << ",  Theta: "  << m_Theta.GetAsFloat32()
       << ",  Phi: "    << m_Phi.GetAsFloat32() << "\n";

    return ss.str();
}